

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw0_subh0_w16_avx2
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,uint8_t *mask,int mask_stride,int h,int w,__m256i *round_offset,
               int shift,__m256i *clip_low,__m256i *clip_high,__m256i *mask_max)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar1 [16];
  undefined1 in_ZMM0 [64];
  long in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m256i mask0a;
  __m128i masks_b8;
  __m128i masks_a8;
  int j;
  int i;
  int in_stack_000002ec;
  CONV_BUF_TYPE *in_stack_000002f0;
  int in_stack_000002fc;
  CONV_BUF_TYPE *in_stack_00000300;
  int in_stack_0000030c;
  uint16_t *in_stack_00000310;
  undefined4 in_stack_fffffffffffffebc;
  __m256i *in_stack_fffffffffffffed8;
  __m256i local_120;
  undefined1 local_100 [32];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  int local_a4;
  int local_a0;
  int local_9c;
  long local_98;
  int local_8c;
  long local_88;
  int local_7c;
  long local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_9c = in_R9D;
  local_98 = in_R8;
  local_8c = in_ECX;
  local_88 = in_RDX;
  local_7c = in_ESI;
  local_78 = in_RDI;
  for (local_a0 = 0; local_a0 < mask_stride; local_a0 = local_a0 + 2) {
    for (local_a4 = 0; auVar1 = in_ZMM0._0_16_, local_a4 < h; local_a4 = local_a4 + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + local_a4));
      local_c0 = auVar1;
      xx_loadu_128((void *)(in_stack_00000008 + (int)mask + (long)local_a4));
      local_60 = local_c0._0_8_;
      uStack_58 = local_c0._8_8_;
      local_100 = vpmovzxbw_avx2(local_c0);
      local_d0._0_8_ = auVar1._0_8_;
      local_d0._8_8_ = auVar1._8_8_;
      local_70 = local_d0._0_8_;
      uStack_68 = local_d0._8_8_;
      local_120 = (__m256i)vpmovzxbw_avx2(auVar1);
      in_ZMM0 = ZEXT1664(local_120._0_16_);
      local_d0 = auVar1;
      highbd_blend_a64_d16_mask_w16_avx2
                (in_stack_00000310,in_stack_0000030c,in_stack_00000300,in_stack_000002fc,
                 in_stack_000002f0,in_stack_000002ec,&local_120,
                 (__m256i *)CONCAT44(in_stack_0000002c,w),
                 (__m256i *)CONCAT44(in_stack_fffffffffffffebc,round_offset._0_4_),shift,clip_low,
                 clip_high,in_stack_fffffffffffffed8);
    }
    local_78 = local_78 + (long)(local_7c << 1) * 2;
    local_88 = local_88 + (long)(local_8c << 1) * 2;
    local_98 = local_98 + (long)(local_9c << 1) * 2;
    in_stack_00000008 = in_stack_00000008 + ((int)mask << 1);
  }
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw0_subh0_w16_avx2(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const uint8_t *mask,
    int mask_stride, int h, int w, const __m256i *round_offset, int shift,
    const __m256i *clip_low, const __m256i *clip_high,
    const __m256i *mask_max) {
  for (int i = 0; i < h; i += 2) {
    for (int j = 0; j < w; j += 16) {
      // Load 16x u8 alpha-mask values from each of two rows and pad to u16
      const __m128i masks_a8 = xx_loadu_128(mask + j);
      const __m128i masks_b8 = xx_loadu_128(mask + mask_stride + j);
      const __m256i mask0a = _mm256_cvtepu8_epi16(masks_a8);
      const __m256i mask0b = _mm256_cvtepu8_epi16(masks_b8);

      highbd_blend_a64_d16_mask_w16_avx2(
          dst + j, dst_stride, src0 + j, src0_stride, src1 + j, src1_stride,
          &mask0a, &mask0b, round_offset, shift, clip_low, clip_high, mask_max);
    }
    dst += dst_stride * 2;
    src0 += src0_stride * 2;
    src1 += src1_stride * 2;
    mask += mask_stride * 2;
  }
}